

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall XipFile::FileEntry::tostream(FileEntry *this,XipFile *xip,ReadWriter_ptr *w)

{
  ReadWriter_ptr r;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  ReadWriter *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  (*(this->super_XipEntry)._vptr_XipEntry[6])(&local_28,this,xip);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&w->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  ReadWriter::copyto<std::shared_ptr<ReadWriter>>(local_28,(shared_ptr<ReadWriter> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

virtual void tostream(XipFile& xip, ReadWriter_ptr w)
        {
            ReadWriter_ptr r= getdatareader(xip);

            r->copyto(w);
        }